

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O1

bool __thiscall SAT::propagate(SAT *this)

{
  anon_union_8_2_743a5d44_for_Reason_0 *paVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  Clause *pCVar5;
  char cVar6;
  uint uVar7;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar8;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  anon_union_8_2_743a5d44_for_Reason_0 aVar14;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar15;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar16;
  uint uVar17;
  Lit p;
  char cVar18;
  ulong uVar19;
  long lVar20;
  vec<Lit> *pvVar21;
  vec<WatchElem> *pvVar22;
  bool bVar23;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  
  piVar3 = (this->qhead).data;
  uVar17 = (this->qhead).sz - 1;
  pvVar21 = (this->trail).data;
  uVar10 = (this->trail).sz - 1;
  uVar7 = piVar3[uVar17];
  uVar19 = 0;
  if ((int)uVar7 < (int)pvVar21[uVar10].sz) {
    pvVar21 = pvVar21 + uVar10;
    do {
      piVar3[uVar17] = uVar7 + 1;
      uVar7 = pvVar21->data[uVar7].x;
      pvVar22 = (this->watches).data;
      uVar13 = (ulong)pvVar22[uVar7].sz;
      if (uVar13 != 0) {
        pvVar22 = pvVar22 + uVar7;
        paVar8 = (anon_union_8_2_743a5d44_for_Reason_0 *)pvVar22->data;
        paVar1 = paVar8 + uVar13;
        uVar10 = uVar7 ^ 1;
        paVar15 = paVar8;
        do {
          aVar14._a = (uint64_t)paVar8->_pt;
          uVar11 = (uint)aVar14._a & 3;
          paVar9 = paVar8 + 1;
          if (uVar11 == 2) {
            paVar15->_pt = (Clause *)*(Clause **)paVar8;
            (*engine.propagators.data[paVar8->_a >> 0x20]->_vptr_Propagator[2])
                      (engine.propagators.data[paVar8->_a >> 0x20],paVar8->_a >> 2 & 0x3fffffff,0);
LAB_001c2c31:
            paVar16 = paVar15 + 1;
          }
          else {
            if (uVar11 != 1) {
              if (*(uint *)aVar14._pt < 0x100) {
LAB_001c2c8c:
                abort();
              }
              uVar11 = (aVar14._pt)->data[0].x;
              pcVar4 = (this->assigns).data;
              cVar18 = -pcVar4[(uint)((int)uVar11 >> 1)];
              if ((uVar11 & 1) == 0) {
                cVar18 = pcVar4[(uint)((int)uVar11 >> 1)];
              }
              if (cVar18 != ::l_True.value) {
                if (*(uint *)aVar14._pt < 0x200) goto LAB_001c2c8c;
                uVar2 = *(uint *)(aVar14._a + 8);
                cVar18 = -pcVar4[(uint)((int)uVar2 >> 1)];
                if ((uVar2 & 1) == 0) {
                  cVar18 = pcVar4[(uint)((int)uVar2 >> 1)];
                }
                if (cVar18 != ::l_True.value) {
                  if (uVar11 == uVar10) {
                    (aVar14._pt)->data[0].x = uVar2;
                    *(uint *)(aVar14._a + 8) = uVar10;
                  }
                  uVar11 = *(uint *)aVar14._pt;
                  bVar23 = 0x2ff < uVar11;
                  if (bVar23) {
                    iVar12 = (uVar11 >> 8) - 2;
                    lVar20 = 0;
                    do {
                      if (iVar12 == (int)lVar20) goto LAB_001c2c8c;
                      uVar2 = ((uint *)(aVar14._a + 0xc))[lVar20];
                      cVar18 = -pcVar4[(uint)((int)uVar2 >> 1)];
                      if ((uVar2 & 1) == 0) {
                        cVar18 = pcVar4[(uint)((int)uVar2 >> 1)];
                      }
                      if (cVar18 != ::l_False.value) {
                        *(uint *)(aVar14._a + 8) = uVar2;
                        ((uint *)(aVar14._a + 0xc))[lVar20] = uVar10;
                        if (*(uint *)aVar14._pt < 0x200) goto LAB_001c2c8c;
                        local_38._a = aVar14._a;
                        vec<WatchElem>::push
                                  ((this->watches).data + ((ulong)*(uint *)(aVar14._a + 8) ^ 1),
                                   (WatchElem *)&local_38);
                        paVar16 = paVar15;
                        if (bVar23) goto LAB_001c2c34;
                        break;
                      }
                      bVar23 = (int)lVar20 + 3U < uVar11 >> 8;
                      lVar20 = lVar20 + 1;
                    } while (iVar12 != (int)lVar20);
                  }
                  paVar15->_pt = (Clause *)aVar14;
                  if (*(uint *)aVar14._pt < 0x100) goto LAB_001c2c8c;
                  paVar16 = paVar15 + 1;
                  p.x = (aVar14._pt)->data[0].x;
                  cVar18 = (this->assigns).data[(uint)(p.x >> 1)];
                  cVar6 = -cVar18;
                  if ((p.x & 1U) == 0) {
                    cVar6 = cVar18;
                  }
                  if (cVar6 != ::l_False.value) goto LAB_001c2c2c;
                  this->confl = (Clause *)aVar14;
                  piVar3[uVar17] = pvVar21->sz;
                  if (paVar9 < paVar1) {
                    do {
                      aVar14._pt = *(Clause **)paVar9;
                      paVar9 = paVar9 + 1;
                      *paVar16 = aVar14;
                      paVar16 = paVar16 + 1;
                    } while (paVar9 < paVar1);
                    goto LAB_001c2c34;
                  }
                  goto LAB_001c2c31;
                }
              }
              paVar15->_pt = (Clause *)aVar14;
              goto LAB_001c2c31;
            }
            paVar15->_pt = (Clause *)*(Clause **)paVar8;
            paVar16 = paVar15 + 1;
            uVar13 = paVar8->_a;
            p.x = (int)(uVar13 >> 0x20);
            cVar18 = (this->assigns).data[(long)uVar13 >> 0x21 & 0xffffffff];
            cVar6 = -cVar18;
            if ((uVar13 >> 0x20 & 1) == 0) {
              cVar6 = cVar18;
            }
            if (cVar6 != -1) {
              aVar14._pt = (Clause *)(((long)(int)uVar7 ^ 1U) * 4 + 2);
              if (cVar6 == '\0') {
LAB_001c2c2c:
                enqueue(this,p,(Reason)aVar14);
              }
              goto LAB_001c2c31;
            }
            pCVar5 = this->short_confl;
            uVar11 = *(uint *)pCVar5;
            if ((uVar11 < 0x100) || (pCVar5->data[0].x = p.x, uVar11 < 0x200)) goto LAB_001c2c8c;
            *(uint *)(pCVar5 + 1) = uVar10;
            this->confl = pCVar5;
            piVar3[uVar17] = pvVar21->sz;
            if (paVar1 <= paVar9) goto LAB_001c2c31;
            do {
              aVar14._pt = *(Clause **)paVar9;
              paVar9 = paVar9 + 1;
              *paVar16 = aVar14;
              paVar16 = paVar16 + 1;
            } while (paVar9 < paVar1);
          }
LAB_001c2c34:
          paVar8 = paVar9;
          paVar15 = paVar16;
        } while (paVar9 != paVar1);
        pvVar22->sz = pvVar22->sz - (int)((ulong)((long)paVar9 - (long)paVar16) >> 3);
      }
      uVar10 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar10;
      uVar7 = piVar3[uVar17];
    } while ((int)uVar7 < (int)pvVar21->sz);
    uVar19 = (ulong)uVar10;
  }
  this->propagations = this->propagations + uVar19;
  return this->confl == (Clause *)0x0;
}

Assistant:

bool SAT::propagate() {
	int num_props = 0;

	int& qhead = this->qhead.last();
	vec<Lit>& trail = this->trail.last();

	while (qhead < static_cast<int>(trail.size())) {
		num_props++;

		const Lit p = trail[qhead++];  // 'p' is enqueued fact to propagate.
		vec<WatchElem>& ws = watches[toInt(p)];

		if (ws.size() == 0) {
			continue;
		}

		WatchElem* i;
		WatchElem* j;
		WatchElem* end;

		for (i = j = ws, end = i + ws.size(); i != end;) {
			const WatchElem& we = *i;
			switch (we.type()) {
				case 1: {
					// absorbed binary clause
					*j++ = *i++;
					const Lit q = toLit(we.d2());
					switch (toInt(value(q))) {
						case 0:
							enqueue(q, ~p);
							break;
						case -1:
							setConfl(q, ~p);
							qhead = trail.size();
							while (i < end) {
								*j++ = *i++;
							}
							break;
						default:;
					}
					continue;
				}
				case 2: {
					// wake up FD propagator
					*j++ = *i++;
					engine.propagators[we.d2()]->wakeup(we.d1(), 0);
					continue;
				}
				default:
					Clause& c = *we.pt();
					i++;

					// Check if already satisfied
					if (value(c[0]) == l_True || value(c[1]) == l_True) {
						*j++ = &c;
						continue;
					}

					const Lit false_lit = ~p;

					// Make sure the false literal is data[1]:
					if (c[0] == false_lit) {
						c[0] = c[1], c[1] = false_lit;
					}

					// Look for new watch:
					for (unsigned int k = 2; k < c.size(); k++) {
						if (value(c[k]) != l_False) {
							c[1] = c[k];
							c[k] = false_lit;
							watches[toInt(~c[1])].push(&c);
							goto FoundWatch;
						}
					}

					// Did not find watch -- clause is unit under assignment:
					*j++ = &c;
					if (value(c[0]) == l_False) {
						confl = &c;
						qhead = trail.size();
						while (i < end) {
							*j++ = *i++;
						}
					} else {
						enqueue(c[0], &c);
					}
				FoundWatch:;
			}
		}
		ws.shrink(static_cast<int>(i - j));
	}
	propagations += num_props;

	return (confl == nullptr);
}